

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O2

QByteArray * escapeDependencyPath<QByteArray>(QByteArray *__return_storage_ptr__,QByteArray *path)

{
  long lVar1;
  char ch;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  uVar5 = (path->d).size;
  iVar2 = (int)uVar5;
  QByteArray::reserve(__return_storage_ptr__,(long)iVar2);
  uVar3 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar2 < 1) {
    uVar5 = uVar3;
  }
  do {
    if (uVar3 == uVar5) {
      return __return_storage_ptr__;
    }
    ch = (path->d).ptr[uVar3];
    if (ch == '$') {
LAB_001175a1:
      QByteArray::append(__return_storage_ptr__,ch);
    }
    else {
      if (ch == '#') {
        ch = '\\';
        goto LAB_001175a1;
      }
      uVar4 = uVar3;
      if (ch == ' ') {
        do {
          QByteArray::append(__return_storage_ptr__,'\\');
          if ((long)uVar4 < 2) break;
          lVar1 = uVar4 - 1;
          uVar4 = uVar4 - 1;
        } while ((path->d).ptr[lVar1] == '\\');
      }
    }
    QByteArray::append(__return_storage_ptr__,(path->d).ptr[uVar3]);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}